

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefTest(TranslateToFuzzReader *this,Type type)

{
  Type TVar1;
  uint32_t uVar2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  HeapType local_40;
  HeapType local_38;
  Type local_30;
  Type refType;
  Type castType;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12a4,"Expression *wasm::TranslateToFuzzReader::makeRefTest(Type)");
  }
  if ((~(this->wasm->features).features & 0x500) != 0) {
    __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12a5,"Expression *wasm::TranslateToFuzzReader::makeRefTest(Type)");
  }
  local_30.id = 0;
  refType.id = 0;
  uVar2 = Random::upTo(&this->random,3);
  if (uVar2 == 2) {
    refType = getReferenceType(this);
    local_30 = getSubType(this,refType);
  }
  else {
    if (uVar2 != 1) {
      if (uVar2 != 0) {
        wasm::handle_unreachable
                  ("bad case",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x12c2);
      }
      local_30 = getReferenceType(this);
      refType = getReferenceType(this);
      local_40 = Type::getHeapType(&local_30);
      BVar3 = HeapType::getBottom(&local_40);
      local_38 = Type::getHeapType(&refType);
      BVar4 = HeapType::getBottom(&local_38);
      if (BVar3 == BVar4) goto LAB_00149e06;
    }
    local_30 = getReferenceType(this);
    refType = getSubType(this,local_30);
  }
LAB_00149e06:
  pEVar5 = make(this,local_30);
  TVar1 = refType;
  pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  pEVar6->_id = RefTestId;
  (pEVar6->type).id = 0;
  *(Expression **)(pEVar6 + 1) = pEVar5;
  pEVar6[1].type.id = TVar1.id;
  wasm::RefTest::finalize();
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefTest(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  // The case of the reference and the cast type having a connection is useful,
  // so give a decent chance for one to be a subtype of the other.
  Type refType, castType;
  switch (upTo(3)) {
    case 0:
      // Totally random.
      refType = getReferenceType();
      castType = getReferenceType();
      // They must share a bottom type in order to validate.
      if (refType.getHeapType().getBottom() ==
          castType.getHeapType().getBottom()) {
        break;
      }
      // Otherwise, fall through and generate things in a way that is
      // guaranteed to validate.
      [[fallthrough]];
    case 1:
      // Cast is a subtype of ref.
      refType = getReferenceType();
      castType = getSubType(refType);
      break;
    case 2:
      // Ref is a subtype of cast.
      castType = getReferenceType();
      refType = getSubType(castType);
      break;
    default:
      // This unreachable avoids a warning on refType being possibly undefined.
      WASM_UNREACHABLE("bad case");
  }
  return builder.makeRefTest(make(refType), castType);
}